

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

int z_inflateReset(z_streamp strm)

{
  ct_data_s *pcVar1;
  internal_state *piVar2;
  int iVar3;
  
  iVar3 = -2;
  if ((strm != (z_streamp)0x0) && (piVar2 = strm->state, piVar2 != (internal_state *)0x0)) {
    iVar3 = 0;
    *(undefined4 *)&piVar2->field_0x1c = 0;
    strm->total_out = 0;
    strm->total_in = 0;
    strm->msg = (char *)0x0;
    strm->adler = 1;
    piVar2->strm = (z_streamp)0x0;
    *(undefined4 *)&piVar2->field_0xc = 0;
    *(undefined4 *)((long)&piVar2->pending_buf + 4) = 0x8000;
    piVar2->pending_out = (z_Bytef *)0x0;
    *(undefined8 *)&piVar2->wrap = 0;
    *(undefined4 *)((long)&piVar2->gzhead + 4) = 0;
    piVar2->last_flush = 0;
    piVar2->w_size = 0;
    pcVar1 = piVar2->dyn_ltree + 0x123;
    *(ct_data_s **)&piVar2->hash_shift = pcVar1;
    piVar2->prev = (Posf *)pcVar1;
    *(ct_data_s **)&piVar2->window_size = pcVar1;
  }
  return iVar3;
}

Assistant:

int ZEXPORT inflateReset(strm)
z_streamp strm;
{
    struct inflate_state FAR *state;

    if (strm == Z_NULL || strm->state == Z_NULL) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    strm->total_in = strm->total_out = state->total = 0;
    strm->msg = Z_NULL;
    strm->adler = 1;        /* to support ill-conceived Java test suite */
    state->mode = HEAD;
    state->last = 0;
    state->havedict = 0;
    state->dmax = 32768U;
    state->head = Z_NULL;
    state->wsize = 0;
    state->whave = 0;
    state->write = 0;
    state->hold = 0;
    state->bits = 0;
    state->lencode = state->distcode = state->next = state->codes;
    Tracev((stderr, "inflate: reset\n"));
    return Z_OK;
}